

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TSPStateImp.cpp
# Opt level: O0

void __thiscall
TSPStateImp::PrintSolution(TSPStateImp *this,vector<int,_std::allocator<int>_> *state)

{
  bool bVar1;
  reference piVar2;
  ostream *poVar3;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_28;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_20;
  iterator iter;
  vector<int,_std::allocator<int>_> *state_local;
  TSPStateImp *this_local;
  
  iter._M_current = (int *)state;
  std::operator<<((ostream *)&std::cout,'\t');
  local_20._M_current = (int *)std::vector<int,_std::allocator<int>_>::begin(iter._M_current);
  while( true ) {
    local_28._M_current = (int *)std::vector<int,_std::allocator<int>_>::end(iter._M_current);
    bVar1 = __gnu_cxx::operator!=(&local_20,&local_28);
    if (!bVar1) break;
    piVar2 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&local_20);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*piVar2);
    std::operator<<(poVar3," ");
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&local_20);
  }
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void TSPStateImp::PrintSolution(std::vector<int> *state)
{
	std::cout << '\t';
	for (auto iter = state->begin(); iter != state->end(); ++iter)
		std::cout << *iter << " ";
	std::cout << std::endl;

}